

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-visitor-test.cc
# Opt level: O0

void __thiscall
ExprVisitorTest_VisitStringLiteral_Test::TestBody(ExprVisitorTest_VisitStringLiteral_Test *this)

{
  StringLiteral other;
  StringRef value;
  StringLiteral value_00;
  bool bVar1;
  MockSpec<TestResult_(mp::StringLiteral)> *message;
  CStringRef arg0;
  AssertHelper *this_00;
  UnsupportedError *e_1;
  bool gtest_caught_expected;
  string gtest_expected_message;
  AssertionResult gtest_ar;
  Expr base;
  StringLiteral e;
  BasicExprVisitor<NullVisitor,_TestResult,_mp::internal::ExprTypes> *in_stack_00000558;
  ExprBase in_stack_00000560;
  Matcher<mp::StringLiteral> *in_stack_fffffffffffffe88;
  MockVisitor *in_stack_fffffffffffffe90;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  Kind in_stack_fffffffffffffea4;
  undefined4 in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  char *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  Type in_stack_fffffffffffffebc;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  Matcher<mp::StringLiteral> *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  AssertHelper *in_stack_ffffffffffffff10;
  BasicCStringRef<char> local_a8;
  string local_a0 [32];
  char *in_stack_ffffffffffffff80;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff94;
  char *in_stack_ffffffffffffff98;
  MockSpec<TestResult_(mp::StringLiteral)> *in_stack_ffffffffffffffa0;
  
  fmt::BasicStringRef<char>::BasicStringRef
            ((BasicStringRef<char> *)in_stack_fffffffffffffe90,(char *)in_stack_fffffffffffffe88);
  value.size_._0_4_ = in_stack_fffffffffffffeb8;
  value.data_ = in_stack_fffffffffffffeb0;
  value.size_._4_4_ = in_stack_fffffffffffffebc;
  mp::BasicExprFactory<std::allocator<char>_>::MakeStringLiteral
            ((BasicExprFactory<std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),value);
  value_00.super_BasicExpr<(mp::expr::Kind)70,_(mp::expr::Kind)70>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffffed4;
  value_00.super_BasicExpr<(mp::expr::Kind)70,_(mp::expr::Kind)70>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffffed0;
  testing::Matcher<mp::StringLiteral>::Matcher(in_stack_fffffffffffffec8,value_00);
  message = MockVisitor::gmock_VisitStringLiteral
                      (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  testing::internal::MockSpec<TestResult_(mp::StringLiteral)>::InternalExpectedAt
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
             (char *)in_stack_ffffffffffffff88.ptr_,in_stack_ffffffffffffff80);
  testing::Matcher<mp::StringLiteral>::~Matcher((Matcher<mp::StringLiteral> *)0x1499d5);
  other.super_BasicExpr<(mp::expr::Kind)70,_(mp::expr::Kind)70>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffffea4;
  other.super_BasicExpr<(mp::expr::Kind)70,_(mp::expr::Kind)70>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffffea0;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>::BasicExpr<mp::StringLiteral>
            (in_stack_fffffffffffffe98,other,
             (type_conflict)((ulong)in_stack_fffffffffffffe90 >> 0x20));
  mp::BasicExprVisitor<MockVisitor,_TestResult,_mp::internal::ExprTypes>::Visit
            ((BasicExprVisitor<MockVisitor,_TestResult,_mp::internal::ExprTypes> *)in_stack_00000558
             ,(Expr)in_stack_00000560.impl_);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffff80);
  if (bVar1) {
    fmt::BasicCStringRef<char>::BasicCStringRef(&local_a8,"unsupported: {}");
    mp::internal::ExprBase::kind((ExprBase *)0x149a74);
    arg0.data_ = mp::expr::str(in_stack_fffffffffffffea4);
    fmt::format<char_const*>
              (arg0,(char **)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
    in_stack_fffffffffffffec7 = testing::internal::AlwaysTrue();
    if ((bool)in_stack_fffffffffffffec7) {
      testing::StrictMock<NullVisitor>::StrictMock
                ((StrictMock<NullVisitor> *)
                 CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
      mp::BasicExprVisitor<NullVisitor,_TestResult,_mp::internal::ExprTypes>::Visit
                (in_stack_00000558,(Expr)in_stack_00000560.impl_);
      testing::StrictMock<NullVisitor>::~StrictMock
                ((StrictMock<NullVisitor> *)in_stack_fffffffffffffe90);
    }
    testing::AssertionResult::operator<<
              ((AssertionResult *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
               (char (*) [127])CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    std::__cxx11::string::~string(local_a0);
  }
  testing::Message::Message
            ((Message *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
  this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x149df1);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
             in_stack_fffffffffffffebc,in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,
             (char *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
  testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff10,(Message *)message);
  testing::internal::AssertHelper::~AssertHelper(this_00);
  testing::Message::~Message((Message *)0x149e4e);
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x149ea3);
  return;
}

Assistant:

TEST_F(ExprVisitorTest, VisitStringLiteral) {
  auto e = factory_.MakeStringLiteral("foo");
  EXPECT_CALL(visitor_, VisitStringLiteral(e));
  mp::Expr base = e;
  visitor_.Visit(base);
  TEST_UNHANDLED(base);
}